

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::ReadOnlyList<BranchJumpTableWrapper*,Memory::ArenaAllocator,DefaultComparer>>
               (AllocatorType *allocator,
               ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer> *obj)

{
  size_t sVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer> *obj_local;
  AllocatorType *allocator_local;
  
  (*obj->_vptr_ReadOnlyList[2])();
  local_40 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>_>
                     ::GetFreeFunc();
  plVar2 = (long *)((long)&(allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                           .super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *plVar2 + -1);
  }
  sVar1 = _AllocatorDelete<JsUtil::ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>,_(Memory::AllocatorDeleteFlags)0>
          ::Size();
  (*local_40)(plVar2,obj,sVar1);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}